

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
::Clean(WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
        *this)

{
  if ((this->disableCleanup == false) &&
     (this->recycler->weakReferenceCleanupId != this->lastWeakReferenceCleanupId)) {
    WeaklyReferencedKeyDictionary<Js::FunctionBody_const,Js::ScriptContext::RejitStats*,DefaultComparer<Js::FunctionBody_const*>,true>
    ::
    Map<JsUtil::WeaklyReferencedKeyDictionary<Js::FunctionBody_const,Js::ScriptContext::RejitStats*,DefaultComparer<Js::FunctionBody_const*>,true>::Clean()::_lambda(Js::FunctionBody_const*,Js::ScriptContext::RejitStats*,Memory::RecyclerWeakReference<Js::FunctionBody_const>const*)_1_>
              ((WeaklyReferencedKeyDictionary<Js::FunctionBody_const,Js::ScriptContext::RejitStats*,DefaultComparer<Js::FunctionBody_const*>,true>
                *)this);
    this->lastWeakReferenceCleanupId = this->recycler->weakReferenceCleanupId;
  }
  return 0 < this->freeCount;
}

Assistant:

bool Clean()
        {
            if (!disableCleanup && recycler->GetWeakReferenceCleanupId() != this->lastWeakReferenceCleanupId)
            {
                Map([](TKey * key, TValue value, const RecyclerWeakReference<TKey>* weakRef) {});
                this->lastWeakReferenceCleanupId = recycler->GetWeakReferenceCleanupId();
            }

            return freeCount > 0;
        }